

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.h
# Opt level: O1

void __thiscall
Nova::Grid_Iterator<float,_3>::Add_Region(Grid_Iterator<float,_3> *this,Range<int,_3> *region_input)

{
  int *piVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  Vector<int,_3,_true> *pVVar5;
  Vector<int,_3,_true> data_copy;
  
  data_copy._data._M_elems[2] = (region_input->max_corner)._data._M_elems[2];
  data_copy._data._M_elems._0_8_ = *(undefined8 *)(region_input->max_corner)._data._M_elems;
  lVar4 = 0;
  do {
    piVar1 = (int *)((long)data_copy._data._M_elems + lVar4);
    *piVar1 = *piVar1 - *(int *)((long)(region_input->min_corner)._data._M_elems + lVar4);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  pVVar5 = &data_copy;
  lVar4 = 4;
  do {
    if (*(int *)((long)data_copy._data._M_elems + lVar4) < (pVVar5->_data)._M_elems[0]) {
      pVVar5 = (Vector<int,_3,_true> *)((long)data_copy._data._M_elems + lVar4);
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  if (-1 < (pVVar5->_data)._M_elems[0]) {
    iVar2 = this->number_of_regions;
    this->number_of_regions = iVar2 + 1;
    if (this->regions + iVar2 != region_input) {
      uVar3 = *(undefined8 *)(region_input->min_corner)._data._M_elems;
      this->regions[iVar2].min_corner._data._M_elems[2] =
           (region_input->min_corner)._data._M_elems[2];
      *(undefined8 *)this->regions[iVar2].min_corner._data._M_elems = uVar3;
      uVar3 = *(undefined8 *)(region_input->max_corner)._data._M_elems;
      this->regions[iVar2].max_corner._data._M_elems[2] =
           (region_input->max_corner)._data._M_elems[2];
      *(undefined8 *)this->regions[iVar2].max_corner._data._M_elems = uVar3;
    }
  }
  return;
}

Assistant:

TV Edge_Lengths() const
    {
        return max_corner-min_corner;
    }